

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_sqrt(secp256k1_fe *a,secp256k1_fe *k)

{
  uint uVar1;
  undefined8 uVar2;
  uint64_t *t;
  char *pcVar3;
  secp256k1_fe r1;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  uVar1 = secp256k1_fe_sqrt(&local_48,a);
  if (uVar1 == (k == (secp256k1_fe *)0x0)) {
    pcVar3 = "test condition failed: (v == 0) == (k == NULL)";
    uVar2 = 0xc84;
LAB_0012ff2b:
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/tests.c"
            ,uVar2,pcVar3);
    abort();
  }
  if (k != (secp256k1_fe *)0x0) {
    local_78.n[0] = 0x3ffffbfffff0bc - local_48.n[0];
    local_78.n[1] = 0x3ffffffffffffc - local_48.n[1];
    local_78.n[2] = 0x3ffffffffffffc - local_48.n[2];
    local_78.n[3] = 0x3ffffffffffffc - local_48.n[3];
    local_78.n[4] = 0x3fffffffffffc - local_48.n[4];
    secp256k1_fe_impl_add(&local_48,k);
    secp256k1_fe_impl_add(&local_78,k);
    secp256k1_fe_impl_normalize(&local_48);
    secp256k1_fe_impl_normalize(&local_78);
    if ((((local_48.n[1] != 0 || local_48.n[3] != 0) || (local_48.n[0] != 0 || local_48.n[2] != 0))
         || local_48.n[4] != 0) &&
       (((local_78.n[1] != 0 || local_78.n[3] != 0) || (local_78.n[0] != 0 || local_78.n[2] != 0))
        || local_78.n[4] != 0)) {
      pcVar3 = "test condition failed: secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2)";
      uVar2 = 0xc8b;
      goto LAB_0012ff2b;
    }
  }
  return;
}

Assistant:

static void test_sqrt(const secp256k1_fe *a, const secp256k1_fe *k) {
    secp256k1_fe r1, r2;
    int v = secp256k1_fe_sqrt(&r1, a);
    CHECK((v == 0) == (k == NULL));

    if (k != NULL) {
        /* Check that the returned root is +/- the given known answer */
        secp256k1_fe_negate(&r2, &r1, 1);
        secp256k1_fe_add(&r1, k); secp256k1_fe_add(&r2, k);
        secp256k1_fe_normalize(&r1); secp256k1_fe_normalize(&r2);
        CHECK(secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2));
    }
}